

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign0.c
# Opt level: O3

_Bool COSE_Sign0_Sign(HCOSE_SIGN0 h,cn_cbor *pKey,cose_errback *perr)

{
  _Bool _Var1;
  eckey_t_conflict eckey;
  eckey_t local_110;
  
  if (pKey == (cn_cbor *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_PARAMETER;
    }
    _Var1 = false;
  }
  else {
    _Var1 = eckey_from_cbor(&local_110,pKey,perr);
    if (_Var1) {
      _Var1 = COSE_Sign0_Sign_eckey(h,(eckey_t_conflict *)&local_110,perr);
    }
    else {
      _Var1 = false;
    }
    eckey_release(&local_110);
  }
  return _Var1;
}

Assistant:

bool COSE_Sign0_Sign(HCOSE_SIGN0 h, const cn_cbor * pKey, cose_errback * perr)
{
	bool ret = false;
	eckey_t eckey;

	CHECK_CONDITION(pKey != NULL, COSE_ERR_INVALID_PARAMETER);
	if (eckey_from_cbor(&eckey, pKey, perr))
	{
		ret = COSE_Sign0_Sign_eckey(h, &eckey, perr);
	}

	eckey_release(&eckey);

errorReturn:
	return ret;
}